

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.h
# Opt level: O0

void sse::common::zero<float>(float *pDst,int len)

{
  int len_local;
  float *pDst_local;
  __m128 a;
  int local_1fc;
  float *local_1f8;
  
  local_1f8 = pDst;
  for (local_1fc = len; 0xf < local_1fc; local_1fc = local_1fc + -0x10) {
    local_1f8[0] = 0.0;
    local_1f8[1] = 0.0;
    local_1f8[2] = 0.0;
    local_1f8[3] = 0.0;
    local_1f8[4] = 0.0;
    local_1f8[5] = 0.0;
    local_1f8[6] = 0.0;
    local_1f8[7] = 0.0;
    local_1f8[8] = 0.0;
    local_1f8[9] = 0.0;
    local_1f8[10] = 0.0;
    local_1f8[0xb] = 0.0;
    local_1f8[0xc] = 0.0;
    local_1f8[0xd] = 0.0;
    local_1f8[0xe] = 0.0;
    local_1f8[0xf] = 0.0;
    local_1f8 = local_1f8 + 0x10;
  }
  if (7 < local_1fc) {
    local_1f8[0] = 0.0;
    local_1f8[1] = 0.0;
    local_1f8[2] = 0.0;
    local_1f8[3] = 0.0;
    local_1f8[4] = 0.0;
    local_1f8[5] = 0.0;
    local_1f8[6] = 0.0;
    local_1f8[7] = 0.0;
    local_1fc = local_1fc + -8;
    local_1f8 = local_1f8 + 8;
  }
  if (3 < local_1fc) {
    local_1f8[0] = 0.0;
    local_1f8[1] = 0.0;
    local_1f8[2] = 0.0;
    local_1f8[3] = 0.0;
    local_1fc = local_1fc + -4;
    local_1f8 = local_1f8 + 4;
  }
  for (; 0 < local_1fc; local_1fc = local_1fc + -1) {
    *local_1f8 = 0.0;
    local_1f8 = local_1f8 + 1;
  }
  return;
}

Assistant:

_SIMD_SSE_T void zero(_T* pDst, int len)
        {
            set<_T>((_T)0, pDst, len);
        }